

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc4.cc
# Opt level: O1

void RC4(RC4_KEY *key,size_t len,uchar *indata,uchar *outdata)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar3 = key->x;
  uVar4 = (ulong)uVar3;
  uVar5 = key->y;
  uVar6 = (ulong)uVar5;
  if (len != 0) {
    sVar7 = 0;
    do {
      uVar3 = (int)uVar4 + 1U & 0xff;
      uVar4 = (ulong)uVar3;
      uVar1 = key->data[uVar4];
      uVar5 = (int)uVar6 + uVar1 & 0xff;
      uVar6 = (ulong)uVar5;
      uVar2 = key->data[uVar6];
      key->data[uVar4] = uVar2;
      key->data[uVar6] = uVar1;
      outdata[sVar7] = indata[sVar7] ^ (byte)key->data[uVar2 + uVar1 & 0xff];
      sVar7 = sVar7 + 1;
    } while (len != sVar7);
  }
  key->x = uVar3;
  key->y = uVar5;
  return;
}

Assistant:

void RC4(RC4_KEY *key, size_t len, const uint8_t *in, uint8_t *out) {
  uint32_t x = key->x;
  uint32_t y = key->y;
  uint32_t *d = key->data;

  for (size_t i = 0; i < len; i++) {
    x = (x + 1) & 0xff;
    uint32_t tx = d[x];
    y = (tx + y) & 0xff;
    uint32_t ty = d[y];
    d[x] = ty;
    d[y] = tx;
    out[i] = d[(tx + ty) & 0xff] ^ in[i];
  }

  key->x = x;
  key->y = y;
}